

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O2

void test_bson_as_canonical_extended_json_dbpointer(void)

{
  char cVar1;
  int iVar2;
  undefined8 uVar3;
  char *__s;
  size_t sVar4;
  char *__s1;
  char *__s2;
  ushort **ppuVar5;
  char *pcVar6;
  long lVar7;
  size_t len;
  bson_oid_t oid;
  
  bson_oid_init_from_string(&oid,"12341234123412abcdababcd");
  uVar3 = bson_new();
  cVar1 = bson_append_dbpointer(uVar3,"p",1,"coll",&oid);
  if (cVar1 == '\0') {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x27f,"test_bson_as_canonical_extended_json_dbpointer",
            "BSON_APPEND_DBPOINTER (b, \"p\", \"coll\", &oid)");
    abort();
  }
  __s = (char *)bson_as_canonical_extended_json(uVar3,&len);
  sVar4 = strlen(__s);
  __s1 = (char *)bson_malloc0(sVar4 + 1);
  __s2 = (char *)bson_malloc0(0x62);
  lVar7 = 0;
  ppuVar5 = __ctype_b_loc();
  pcVar6 = __s;
  do {
    do {
      cVar1 = *pcVar6;
      pcVar6 = pcVar6 + 1;
    } while ((*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) != 0);
    __s1[lVar7] = cVar1;
    lVar7 = lVar7 + 1;
  } while (*pcVar6 != '\0');
  pcVar6 = 
  "{ \"p\" : { \"$dbPointer\" : { \"$ref\" : \"coll\", \"$id\" : { \"$oid\" : \"12341234123412abcdababcd\" } } } }"
  ;
  lVar7 = 0;
  do {
    do {
      cVar1 = *pcVar6;
      pcVar6 = pcVar6 + 1;
    } while ((*(byte *)((long)*ppuVar5 + (long)cVar1 * 2 + 1) & 0x20) != 0);
    __s2[lVar7] = cVar1;
    lVar7 = lVar7 + 1;
  } while (*pcVar6 != '\0');
  iVar2 = strcmp(__s1,__s2);
  if (iVar2 == 0) {
    bson_free(__s1);
    bson_free(__s2);
    bson_free(__s);
    bson_destroy(uVar3);
    return;
  }
  fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n%s:%d  %s()\n",__s1,__s2,
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
          0x284,"test_bson_as_canonical_extended_json_dbpointer");
  abort();
}

Assistant:

static void
test_bson_as_canonical_extended_json_dbpointer (void)
{
   bson_oid_t oid;
   bson_t *b;
   size_t len;
   char *str;

   bson_oid_init_from_string (&oid, "12341234123412abcdababcd");
   b = bson_new ();
   BSON_ASSERT (BSON_APPEND_DBPOINTER (b, "p", "coll", &oid));
   str = bson_as_canonical_extended_json (b, &len);
   ASSERT_CMPJSON (str,
                   "{ \"p\" : { \"$dbPointer\" : { \"$ref\" : "
                   "\"coll\", \"$id\" : { \"$oid\" : "
                   "\"12341234123412abcdababcd\" } } } }");

   bson_destroy (b);
}